

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O0

void __thiscall re2::Prog::Flatten(Prog *this)

{
  iterator pIVar1;
  int iVar2;
  InstOp IVar3;
  int iVar4;
  int iVar5;
  iterator pIVar6;
  iterator pIVar7;
  char *pcVar8;
  size_type sVar9;
  int *piVar10;
  reference pvVar11;
  reference this_00;
  Inst *__dest;
  Inst *__src;
  unsigned_short *puVar12;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  Prog *in_RDI;
  Prog *unaff_retaddr;
  int i_4;
  int i_3;
  int total;
  Inst *ip;
  int id;
  int i_2;
  const_iterator i_1;
  vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> flat;
  vector<int,_std::allocator<int>_> flatmap;
  const_iterator i;
  SparseArray<int> sorted;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  predvec;
  SparseArray<int> predmap;
  SparseArray<int> rootmap;
  vector<int,_std::allocator<int>_> stk;
  SparseSet reachable;
  PODArray<re2::Prog::Inst> *in_stack_fffffffffffffd48;
  SparseSetT<void> *in_stack_fffffffffffffd50;
  int in_stack_fffffffffffffd5c;
  unsigned_short uVar13;
  Inst *in_stack_fffffffffffffd60;
  IndexValue *in_stack_fffffffffffffd68;
  SparseSetT<void> *in_stack_fffffffffffffd70;
  size_type in_stack_fffffffffffffd78;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd80;
  SparseArray<int> *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  int local_16c;
  int local_148;
  int local_138;
  int local_134;
  IndexValue *local_130;
  vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> local_128;
  vector<int,_std::allocator<int>_> local_108;
  iterator local_f0;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff38;
  SparseSet *in_stack_ffffffffffffff40;
  vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *in_stack_ffffffffffffff48;
  SparseArray<int> *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff5c;
  Prog *in_stack_ffffffffffffff60;
  SparseSet *in_stack_ffffffffffffff68;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_stack_ffffffffffffff70;
  SparseArray<int> *in_stack_ffffffffffffff78;
  SparseArray<int> *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff8c;
  _Head_base<0UL,_int_*,_false> in_stack_ffffffffffffff90;
  _Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false> in_stack_ffffffffffffffa0;
  PODArray<re2::Prog::Inst> local_48 [2];
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffd8;
  SparseSet *in_stack_ffffffffffffffe0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_stack_ffffffffffffffe8;
  SparseArray<int> *in_stack_fffffffffffffff0;
  Prog *rootmap_00;
  
  if ((in_RDI->did_flatten_ & 1U) == 0) {
    in_RDI->did_flatten_ = true;
    rootmap_00 = in_RDI;
    size(in_RDI);
    SparseSetT<void>::SparseSetT
              (in_stack_fffffffffffffd70,(int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x2670b7);
    size(in_RDI);
    std::vector<int,_std::allocator<int>_>::reserve
              (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    size(in_RDI);
    SparseArray<int>::SparseArray
              ((SparseArray<int> *)in_stack_fffffffffffffd70,
               (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
    size(in_RDI);
    SparseArray<int>::SparseArray
              ((SparseArray<int> *)in_stack_fffffffffffffd70,
               (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)0x267153);
    MarkSuccessors(unaff_retaddr,(SparseArray<int> *)rootmap_00,in_stack_fffffffffffffff0,
                   in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    SparseArray<int>::SparseArray
              ((SparseArray<int> *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
               in_stack_fffffffffffffd98);
    SparseArray<int>::begin((SparseArray<int> *)0x2671ae);
    pIVar6 = SparseArray<int>::end((SparseArray<int> *)in_stack_fffffffffffffd50);
    std::
    sort<re2::SparseArray<int>::IndexValue*,bool(*)(re2::SparseArray<int>::IndexValue_const&,re2::SparseArray<int>::IndexValue_const&)>
              ((IndexValue *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
               (_func_bool_IndexValue_ptr_IndexValue_ptr *)in_stack_fffffffffffffd60);
    local_f0 = SparseArray<int>::end((SparseArray<int> *)in_stack_fffffffffffffd50);
    while( true ) {
      local_f0 = local_f0 + -1;
      pIVar1 = local_f0;
      pIVar7 = SparseArray<int>::begin((SparseArray<int> *)0x267235);
      if (pIVar1 == pIVar7) break;
      pcVar8 = SparseArray<int>::IndexValue::index(local_f0,(char *)pIVar6,__c);
      iVar2 = start_unanchored(in_RDI);
      if ((int)pcVar8 != iVar2) {
        pcVar8 = SparseArray<int>::IndexValue::index(local_f0,(char *)pIVar6,__c_00);
        iVar2 = start(in_RDI);
        if ((int)pcVar8 != iVar2) {
          pcVar8 = SparseArray<int>::IndexValue::index(local_f0,(char *)pIVar6,__c_01);
          pIVar6 = (iterator)((ulong)pcVar8 & 0xffffffff);
          in_stack_fffffffffffffd48 = local_48;
          MarkDominator((Prog *)in_stack_ffffffffffffff90._M_head_impl,in_stack_ffffffffffffff8c,
                        in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                        in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                        (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffa0._M_head_impl)
          ;
        }
      }
    }
    SparseArray<int>::size((SparseArray<int> *)&stack0xffffffffffffff80);
    std::allocator<int>::allocator((allocator<int> *)0x2673f3);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd70,
               (size_type)in_stack_fffffffffffffd68,(allocator_type *)in_stack_fffffffffffffd60);
    std::allocator<int>::~allocator((allocator<int> *)0x26741f);
    std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::vector
              ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)0x26742c);
    size(in_RDI);
    std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::reserve
              ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)
               in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    for (local_130 = SparseArray<int>::begin((SparseArray<int> *)0x267468);
        pIVar6 = SparseArray<int>::end((SparseArray<int> *)in_stack_fffffffffffffd50),
        local_130 != pIVar6; local_130 = local_130 + 1) {
      sVar9 = std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::size(&local_128);
      piVar10 = SparseArray<int>::IndexValue::value(local_130);
      pcVar8 = (char *)(long)*piVar10;
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_108,(size_type)pcVar8);
      *pvVar11 = (value_type)sVar9;
      SparseArray<int>::IndexValue::index(local_130,pcVar8,__c_02);
      EmitList(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff50,
               in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::back
                ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)
                 in_stack_fffffffffffffd50);
      Inst::set_last((Inst *)in_stack_fffffffffffffd50);
      piVar10 = SparseArray<int>::IndexValue::value(local_130);
      std::vector<int,_std::allocator<int>_>::operator[](&local_108,(long)*piVar10);
      std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::size(&local_128);
      ComputeHints((Prog *)sorted._0_8_,
                   (vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)i,
                   flatmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_,
                   (int)flatmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    }
    sVar9 = std::vector<int,_std::allocator<int>_>::size(&local_108);
    in_RDI->list_count_ = (int)sVar9;
    for (local_134 = 0; local_134 < 8; local_134 = local_134 + 1) {
      in_RDI->inst_count_[local_134] = 0;
    }
    local_138 = 0;
    while( true ) {
      sVar9 = std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::size(&local_128);
      iVar2 = (int)((ulong)in_stack_fffffffffffffd68 >> 0x20);
      if ((int)sVar9 <= local_138) break;
      this_00 = std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::operator[]
                          (&local_128,(long)local_138);
      IVar3 = Inst::opcode(this_00);
      if (IVar3 != kInstAltMatch) {
        iVar2 = Inst::out(this_00);
        std::vector<int,_std::allocator<int>_>::operator[](&local_108,(long)iVar2);
        Inst::set_out(in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
      }
      IVar3 = Inst::opcode(this_00);
      in_RDI->inst_count_[IVar3] = in_RDI->inst_count_[IVar3] + 1;
      local_138 = local_138 + 1;
    }
    for (local_148 = 0; local_148 < 8; local_148 = local_148 + 1) {
    }
    iVar4 = start_unanchored(in_RDI);
    if (iVar4 != 0) {
      iVar4 = start_unanchored(in_RDI);
      iVar5 = start(in_RDI);
      if (iVar4 == iVar5) {
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_108,1);
        set_start_unanchored(in_RDI,*pvVar11);
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_108,1);
        set_start(in_RDI,*pvVar11);
      }
      else {
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_108,1);
        set_start_unanchored(in_RDI,*pvVar11);
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_108,2);
        set_start(in_RDI,*pvVar11);
      }
    }
    sVar9 = std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::size(&local_128);
    in_RDI->size_ = (int)sVar9;
    PODArray<re2::Prog::Inst>::PODArray
              ((PODArray<re2::Prog::Inst> *)in_stack_fffffffffffffd70,iVar2);
    PODArray<re2::Prog::Inst>::operator=
              ((PODArray<re2::Prog::Inst> *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    PODArray<re2::Prog::Inst>::~PODArray((PODArray<re2::Prog::Inst> *)0x267948);
    __dest = PODArray<re2::Prog::Inst>::data((PODArray<re2::Prog::Inst> *)0x267952);
    __src = std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::data
                      ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)0x267966);
    memmove(__dest,__src,(long)in_RDI->size_ << 3);
    if (in_RDI->size_ < 0x201) {
      PODArray<unsigned_short>::PODArray
                ((PODArray<unsigned_short> *)in_stack_fffffffffffffd70,iVar2);
      PODArray<unsigned_short>::operator=
                ((PODArray<unsigned_short> *)in_stack_fffffffffffffd50,
                 (PODArray<unsigned_short> *)in_stack_fffffffffffffd48);
      PODArray<unsigned_short>::~PODArray((PODArray<unsigned_short> *)0x2679df);
      puVar12 = PODArray<unsigned_short>::data((PODArray<unsigned_short> *)0x2679e9);
      memset(puVar12,0xff,(long)in_RDI->size_ << 1);
      for (local_16c = 0; local_16c < in_RDI->list_count_; local_16c = local_16c + 1) {
        uVar13 = (unsigned_short)local_16c;
        in_stack_fffffffffffffd60 = (Inst *)&in_RDI->list_heads_;
        std::vector<int,_std::allocator<int>_>::operator[](&local_108,(long)local_16c);
        puVar12 = PODArray<unsigned_short>::operator[]
                            ((PODArray<unsigned_short> *)in_stack_fffffffffffffd50,
                             (int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
        *puVar12 = uVar13;
      }
    }
    std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::~vector
              ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)
               in_stack_fffffffffffffd60);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd60);
    SparseArray<int>::~SparseArray((SparseArray<int> *)in_stack_fffffffffffffd50);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)in_stack_fffffffffffffd60);
    SparseArray<int>::~SparseArray((SparseArray<int> *)in_stack_fffffffffffffd50);
    SparseArray<int>::~SparseArray((SparseArray<int> *)in_stack_fffffffffffffd50);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd60);
    SparseSetT<void>::~SparseSetT(in_stack_fffffffffffffd50);
  }
  return;
}

Assistant:

void Prog::Flatten() {
  if (did_flatten_)
    return;
  did_flatten_ = true;

  // Scratch structures. It's important that these are reused by functions
  // that we call in loops because they would thrash the heap otherwise.
  SparseSet reachable(size());
  std::vector<int> stk;
  stk.reserve(size());

  // First pass: Marks "successor roots" and predecessors.
  // Builds the mapping from inst-ids to root-ids.
  SparseArray<int> rootmap(size());
  SparseArray<int> predmap(size());
  std::vector<std::vector<int>> predvec;
  MarkSuccessors(&rootmap, &predmap, &predvec, &reachable, &stk);

  // Second pass: Marks "dominator roots".
  SparseArray<int> sorted(rootmap);
  std::sort(sorted.begin(), sorted.end(), sorted.less);
  for (SparseArray<int>::const_iterator i = sorted.end() - 1;
       i != sorted.begin();
       --i) {
    if (i->index() != start_unanchored() && i->index() != start())
      MarkDominator(i->index(), &rootmap, &predmap, &predvec, &reachable, &stk);
  }

  // Third pass: Emits "lists". Remaps outs to root-ids.
  // Builds the mapping from root-ids to flat-ids.
  std::vector<int> flatmap(rootmap.size());
  std::vector<Inst> flat;
  flat.reserve(size());
  for (SparseArray<int>::const_iterator i = rootmap.begin();
       i != rootmap.end();
       ++i) {
    flatmap[i->value()] = static_cast<int>(flat.size());
    EmitList(i->index(), &rootmap, &flat, &reachable, &stk);
    flat.back().set_last();
    // We have the bounds of the "list", so this is the
    // most convenient point at which to compute hints.
    ComputeHints(&flat, flatmap[i->value()], static_cast<int>(flat.size()));
  }

  list_count_ = static_cast<int>(flatmap.size());
  for (int i = 0; i < kNumInst; i++)
    inst_count_[i] = 0;

  // Fourth pass: Remaps outs to flat-ids.
  // Counts instructions by opcode.
  for (int id = 0; id < static_cast<int>(flat.size()); id++) {
    Inst* ip = &flat[id];
    if (ip->opcode() != kInstAltMatch)  // handled in EmitList()
      ip->set_out(flatmap[ip->out()]);
    inst_count_[ip->opcode()]++;
  }

  int total = 0;
  for (int i = 0; i < kNumInst; i++)
    total += inst_count_[i];
  DCHECK_EQ(total, static_cast<int>(flat.size()));

  // Remap start_unanchored and start.
  if (start_unanchored() == 0) {
    DCHECK_EQ(start(), 0);
  } else if (start_unanchored() == start()) {
    set_start_unanchored(flatmap[1]);
    set_start(flatmap[1]);
  } else {
    set_start_unanchored(flatmap[1]);
    set_start(flatmap[2]);
  }

  // Finally, replace the old instructions with the new instructions.
  size_ = static_cast<int>(flat.size());
  inst_ = PODArray<Inst>(size_);
  memmove(inst_.data(), flat.data(), size_*sizeof inst_[0]);

  // Populate the list heads for BitState.
  // 512 instructions limits the memory footprint to 1KiB.
  if (size_ <= 512) {
    list_heads_ = PODArray<uint16_t>(size_);
    // 0xFF makes it more obvious if we try to look up a non-head.
    memset(list_heads_.data(), 0xFF, size_*sizeof list_heads_[0]);
    for (int i = 0; i < list_count_; ++i)
      list_heads_[flatmap[i]] = i;
  }
}